

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::
     deleteAllValues<std::map<std::__cxx11::string,Catch::IReporterFactory*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IReporterFactory*>>>>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>_>
                *container)

{
  bool bVar1;
  pointer ppVar2;
  const_iterator itEnd;
  const_iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>_>
  *in_stack_ffffffffffffffc8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>
  *in_stack_ffffffffffffffd0;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>
  local_20;
  iterator local_18;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>
  local_10 [2];
  
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>
  ::_Rb_tree_const_iterator(local_10,&local_18);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>_>
       ::end(in_stack_ffffffffffffffc8);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>
  ::_Rb_tree_const_iterator(&local_20,&local_28);
  while( true ) {
    bVar1 = std::operator!=(local_10,&local_20);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>
             ::operator->(in_stack_ffffffffffffffd0);
    in_stack_ffffffffffffffd0 =
         (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>
          *)ppVar2->second;
    if (in_stack_ffffffffffffffd0 !=
        (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>
         *)0x0) {
      (*(code *)in_stack_ffffffffffffffd0->_M_node->_M_parent)();
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>
    ::operator++(in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

inline void deleteAllValues( AssociativeContainerT& container ) {
        typename AssociativeContainerT::const_iterator it = container.begin();
        typename AssociativeContainerT::const_iterator itEnd = container.end();
        for(; it != itEnd; ++it )
            delete it->second;
    }